

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::Read3dmGoo(ON_BinaryArchive *this,ON_3dmGoo *goo)

{
  uint uVar1;
  ON_3DM_BIG_CHUNK *pOVar2;
  long lVar3;
  ulong uVar4;
  uchar *p;
  size_t sVar5;
  char *sFormat;
  int line_number;
  size_t sz;
  bool bVar6;
  
  if (goo->m_goo != (uchar *)0x0) {
    onfree(goo->m_goo);
    goo->m_goo = (uchar *)0x0;
  }
  goo->m_typecode = 0;
  goo->m_value = 0;
  lVar3 = (long)(this->m_chunk).m_count;
  pOVar2 = (this->m_chunk).m_a;
  if (pOVar2 + lVar3 + -1 == (ON_3DM_BIG_CHUNK *)0x0 || lVar3 < 1) {
    return false;
  }
  uVar1 = pOVar2[lVar3 + -1].m_typecode;
  goo->m_typecode = uVar1;
  if (pOVar2[lVar3 + -1].m_bLongChunk == '\0') {
    uVar4 = pOVar2[lVar3 + -1].m_big_value;
    bVar6 = (long)(int)uVar4 == uVar4;
    if (bVar6) goto LAB_0039fa1f;
    sFormat = "i64 too big to convert to 4 byte signed int";
    line_number = 0xee;
  }
  else {
    uVar4 = pOVar2[lVar3 + -1].m_big_value;
    if (pOVar2[lVar3 + -1].m_big_value < 1) {
      uVar4 = 0;
    }
    if ((int)uVar1 < 0) {
      uVar4 = 0;
    }
    bVar6 = uVar4 >> 0x20 == 0;
    if (bVar6) {
      uVar4 = uVar4 & 0xffffffff;
      goto LAB_0039fa1f;
    }
    sFormat = "u64 too big to convert to 4 byte unsigned int";
    line_number = 0xfc;
  }
  uVar4 = 0;
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
             ,line_number,"",sFormat);
LAB_0039fa1f:
  goo->m_value = (int)uVar4;
  if ((((bVar6 != false) && (pOVar2[lVar3 + -1].m_bLongChunk != '\0')) &&
      (0 < pOVar2[lVar3 + -1].m_big_value)) &&
     (this->m_current_positionX == pOVar2[lVar3 + -1].m_start_offset)) {
    pOVar2[lVar3 + -1].m_do_crc16 = '\0';
    pOVar2[lVar3 + -1].m_do_crc32 = '\0';
    this->m_bDoChunkCRC = false;
    sz = pOVar2[lVar3 + -1].m_big_value;
    if (pOVar2[lVar3 + -1].m_big_value < 1) {
      sz = 0;
    }
    if ((int)pOVar2[lVar3 + -1].m_typecode < 0) {
      sz = 0;
    }
    p = (uchar *)onmalloc(sz);
    goo->m_goo = p;
    sVar5 = Read(this,sz,p);
    bVar6 = sVar5 == sz;
  }
  return bVar6;
}

Assistant:

bool ON_BinaryArchive::Read3dmGoo( ON_3dmGoo& goo )
{
  // goo is an entire "chunk" that is not short.
  // A call to EndRead3dmChunk() must immediately follow 
  // the call to Read3dmGoo().
  bool rc = false;
  if (goo.m_goo) 
  {
    onfree(goo.m_goo);
    goo.m_goo = 0;
  }
  goo.m_typecode = 0;
  goo.m_value = 0;
  ON_3DM_BIG_CHUNK* c = m_chunk.Last();
  if (c) 
  {
    goo.m_typecode = c->m_typecode;
    if ( c->m_bLongChunk )
      rc = DownSizeUINT(c->Length(),(ON__UINT32*)&goo.m_value);
    else
      rc = DownSizeINT(c->m_big_value,&goo.m_value);
    if ( rc && c->m_bLongChunk && c->m_big_value > 0 ) 
    {
      if ( CurrentPosition() == c->m_start_offset )
      {
        // read the rest of this chunk into the goo.m_goo buffer.
        // 23 January 2004 Dale Lear:
        //   Have to turn of CRC checking because the goo may contiain
        //   subchunks.  If a CRC exixts, it is at the end of the
        //   goo and will persist until the application that
        //   wrote this chunk is available to parse the chunk.
        c->m_do_crc16 = 0;
        c->m_do_crc32 = 0;
        m_bDoChunkCRC = false;
        size_t sizeof_goo = (size_t)c->Length();
        goo.m_goo = (unsigned char*)onmalloc( sizeof_goo );
        rc = ReadByte( sizeof_goo, goo.m_goo );
      }
    }
  }
  return rc;
}